

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_gencmn.cpp
# Opt level: O2

char * allocString(uint32_t length)

{
  ulong uVar1;
  
  uVar1 = (ulong)stringTop;
  if (length + stringTop < 0x30d41) {
    stringTop = length + stringTop;
    return stringStore + uVar1;
  }
  fwrite("gencmn: out of memory\n",0x16,1,_stderr);
  exit(7);
}

Assistant:

static char *
allocString(uint32_t length) {
    uint32_t top=stringTop+length;
    char *p;

    if(top>STRING_STORE_SIZE) {
        fprintf(stderr, "gencmn: out of memory\n");
        exit(U_MEMORY_ALLOCATION_ERROR);
    }
    p=stringStore+stringTop;
    stringTop=top;
    return p;
}